

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

BrotliDecoderErrorCode
ReadHuffmanCode(uint32_t alphabet_size,HuffmanCode *table,uint32_t *opt_table_size,
               BrotliDecoderStateInternal *s)

{
  uint32_t *puVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  uint16_t *puVar6;
  uint *puVar7;
  byte *pbVar8;
  BrotliDecoderErrorCode BVar9;
  BrotliDecoderErrorCode BVar10;
  int iVar11;
  uint32_t uVar12;
  sbyte sVar13;
  BrotliRunningHuffmanState BVar14;
  uint32_t uVar15;
  BrotliBitReader *br_00;
  long lVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  ulong uVar20;
  char cVar21;
  uint32_t uVar22;
  uint uVar23;
  ulong uVar24;
  uint in_R9D;
  uint uVar25;
  uint uVar26;
  size_t sVar27;
  uint uVar28;
  int iVar29;
  ulong uVar30;
  uint32_t uVar31;
  ulong unaff_R14;
  uint64_t uVar32;
  bool bVar33;
  BrotliBitReader *br;
  
  if (BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS < s->substate_huffman) {
    return BROTLI_DECODER_ERROR_UNREACHABLE;
  }
  br_00 = &s->br;
  uVar23 = alphabet_size & 0x3ff;
  switch(s->substate_huffman) {
  case BROTLI_STATE_HUFFMAN_NONE:
    uVar12 = (s->br).bit_pos_;
    bVar33 = uVar12 - 0x3f < 2;
    if (bVar33) {
      sVar27 = (s->br).avail_in;
      if (sVar27 != 0) {
        uVar24 = (s->br).val_;
        pbVar8 = (s->br).next_in;
        (s->br).val_ = uVar24 >> 8;
        (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar24 >> 8;
        uVar12 = uVar12 - 8;
        (s->br).bit_pos_ = uVar12;
        (s->br).avail_in = sVar27 - 1;
        (s->br).next_in = pbVar8 + 1;
        bVar33 = false;
        goto LAB_00102cf3;
      }
    }
    else {
LAB_00102cf3:
      s->sub_loop_counter = (uint)((s->br).val_ >> ((byte)uVar12 & 0x3f)) & 3;
      (s->br).bit_pos_ = uVar12 + 2;
    }
    if (bVar33) {
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    if (s->sub_loop_counter != 1) {
      s->repeat = 0;
      s->space = 0x20;
      s->code_length_code_lengths[0] = '\0';
      s->code_length_code_lengths[1] = '\0';
      s->code_length_code_lengths[2] = '\0';
      s->code_length_code_lengths[3] = '\0';
      s->code_length_code_lengths[4] = '\0';
      s->code_length_code_lengths[5] = '\0';
      s->code_length_code_lengths[6] = '\0';
      s->code_length_code_lengths[7] = '\0';
      s->code_length_code_lengths[8] = '\0';
      s->code_length_code_lengths[9] = '\0';
      s->code_length_code_lengths[10] = '\0';
      s->code_length_code_lengths[0xb] = '\0';
      s->code_length_code_lengths[0xc] = '\0';
      s->code_length_code_lengths[0xd] = '\0';
      s->code_length_code_lengths[0xe] = '\0';
      s->code_length_code_lengths[0xf] = '\0';
      *(undefined8 *)(s->code_length_code_lengths + 0xe) = 0;
      s->code_length_histo[2] = 0;
      s->code_length_histo[3] = 0;
      s->code_length_histo[4] = 0;
      s->code_length_histo[5] = 0;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
      goto switchD_00102ca4_caseD_4;
    }
    break;
  case BROTLI_STATE_HUFFMAN_SIMPLE_READ:
    goto switchD_00102ca4_caseD_2;
  case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD:
    goto LAB_00102f07;
  case BROTLI_STATE_HUFFMAN_COMPLEX:
switchD_00102ca4_caseD_4:
    uVar24 = (ulong)s->sub_loop_counter;
    uVar12 = s->repeat;
    uVar31 = s->space;
    if (uVar24 < 0x12) {
      uVar22 = (s->br).bit_pos_;
      do {
        bVar3 = "\x01\x02\x03\x04"[uVar24];
        bVar33 = uVar22 - 0x3d < 4;
        if (bVar33) {
          sVar27 = (s->br).avail_in;
          if (sVar27 != 0) {
            uVar30 = (s->br).val_;
            pbVar8 = (s->br).next_in;
            (s->br).val_ = uVar30 >> 8;
            (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar30 >> 8;
            uVar22 = uVar22 - 8;
            (s->br).bit_pos_ = uVar22;
            (s->br).avail_in = sVar27 - 1;
            (s->br).next_in = pbVar8 + 1;
            bVar33 = false;
            goto LAB_00103091;
          }
          bVar33 = true;
        }
        else {
LAB_00103091:
          unaff_R14 = (ulong)((uint)(br_00->val_ >> ((byte)uVar22 & 0x3f)) & 0xf);
        }
        if (bVar33) {
          unaff_R14 = 0;
          if (uVar22 - 0x40 != 0) {
            unaff_R14 = (ulong)((uint)(br_00->val_ >> ((byte)uVar22 & 0x3f)) & 0xf);
          }
          if ((uint)"\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[unaff_R14] <=
              -(uVar22 - 0x40)) goto LAB_001030a6;
          s->sub_loop_counter = (uint32_t)uVar24;
          s->repeat = uVar12;
          s->space = uVar31;
          s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
          cVar21 = '\x01';
        }
        else {
LAB_001030a6:
          bVar2 = ""[unaff_R14 & 0xffffffff];
          uVar22 = uVar22 + "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"
                            [unaff_R14 & 0xffffffff];
          (s->br).bit_pos_ = uVar22;
          s->code_length_code_lengths[bVar3] = bVar2;
          cVar21 = '\0';
          if ((0x1111UL >> (unaff_R14 & 0x3f) & 1) == 0) {
            uVar31 = uVar31 - (0x20U >> (bVar2 & 0x1f));
            uVar12 = uVar12 + 1;
            s->code_length_histo[bVar2] = s->code_length_histo[bVar2] + 1;
            cVar21 = (uVar31 - 0x21 < 0xffffffe0) * '\x02';
          }
        }
        if (cVar21 != '\0') {
          if (cVar21 != '\x02') {
            BVar10 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            goto LAB_0010316c;
          }
          break;
        }
        uVar24 = uVar24 + 1;
      } while ((int)uVar24 != 0x12);
    }
    BVar10 = BROTLI_DECODER_ERROR_FORMAT_CL_SPACE;
    if (uVar31 == 0) {
      BVar10 = BROTLI_DECODER_SUCCESS;
    }
    if (uVar12 == 1) {
      BVar10 = BROTLI_DECODER_SUCCESS;
    }
LAB_0010316c:
    if (BVar10 != BROTLI_DECODER_SUCCESS) {
      return BVar10;
    }
    BrotliBuildCodeLengthsHuffmanTable(s->table,s->code_length_code_lengths,s->code_length_histo);
    s->code_length_histo[8] = 0;
    s->code_length_histo[9] = 0;
    s->code_length_histo[10] = 0;
    s->code_length_histo[0xb] = 0;
    s->code_length_histo[0xc] = 0;
    s->code_length_histo[0xd] = 0;
    s->code_length_histo[0xe] = 0;
    s->code_length_histo[0xf] = 0;
    s->code_length_histo[0] = 0;
    s->code_length_histo[1] = 0;
    s->code_length_histo[2] = 0;
    s->code_length_histo[3] = 0;
    s->code_length_histo[4] = 0;
    s->code_length_histo[5] = 0;
    s->code_length_histo[6] = 0;
    s->code_length_histo[7] = 0;
    puVar6 = s->symbol_lists;
    lVar16 = 0;
    do {
      s->next_symbol[lVar16] = (int)lVar16 + -0x10;
      puVar6[lVar16 + -0x10] = 0xffff;
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x10);
    s->symbol = 0;
    s->repeat = 0;
    s->repeat_code_len = 0;
    s->prev_code_len = 8;
    s->space = 0x8000;
    s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
  case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS:
    uVar12 = s->symbol;
    uVar31 = s->repeat;
    uVar22 = s->space;
    uVar19 = s->repeat_code_len;
    uVar17 = s->prev_code_len;
    puVar6 = s->symbol_lists;
    iVar11 = BrotliWarmupBitReader(br_00);
    BVar10 = BROTLI_DECODER_NEEDS_MORE_INPUT;
    bVar33 = true;
    if (iVar11 != 0) {
      do {
        if ((uVar23 <= uVar12) || (uVar22 == 0)) {
          s->space = uVar22;
          BVar10 = BROTLI_DECODER_SUCCESS;
          bVar33 = false;
          goto LAB_00103417;
        }
        uVar24 = (s->br).avail_in;
        if (uVar24 < 4) {
          s->symbol = uVar12;
          s->repeat = uVar31;
          s->prev_code_len = uVar17;
          s->repeat_code_len = uVar19;
          s->space = uVar22;
          uVar28 = uVar12;
        }
        else {
          uVar25 = (s->br).bit_pos_;
          if (0x1f < uVar25) {
            uVar30 = (s->br).val_;
            puVar7 = (uint *)(s->br).next_in;
            (s->br).val_ = uVar30 >> 0x20;
            (s->br).bit_pos_ = uVar25 ^ 0x20;
            (s->br).val_ = (ulong)*puVar7 << 0x20 | uVar30 >> 0x20;
            (s->br).avail_in = uVar24 - 4;
            (s->br).next_in = (uint8_t *)(puVar7 + 1);
          }
          uVar30 = (s->br).val_;
          uVar15 = (s->br).bit_pos_;
          uVar25 = (uint)(uVar30 >> ((byte)uVar15 & 0x3f)) & 0x1f;
          uVar15 = s->table[uVar25].bits + uVar15;
          (s->br).bit_pos_ = uVar15;
          uVar4 = s->table[uVar25].value;
          if (uVar4 < 0x10) {
            uVar25 = (uint)uVar4;
            if (uVar25 != 0) {
              puVar6[s->next_symbol[uVar25]] = (uint16_t)uVar12;
              s->next_symbol[uVar25] = uVar12;
              uVar22 = uVar22 - (0x8000U >> ((byte)uVar4 & 0x1f));
              s->code_length_histo[uVar25] = s->code_length_histo[uVar25] + 1;
              uVar17 = (uint32_t)uVar4;
            }
            uVar31 = 0;
            uVar28 = uVar12 + 1;
          }
          else {
            uVar20 = 0;
            if (uVar4 == 0x10) {
              uVar20 = (ulong)uVar17;
            }
            uVar25 = uVar4 == 0x10 ^ 3;
            uVar26 = (uint)(uVar30 >> ((byte)uVar15 & 0x3f)) & kBitMask[uVar25];
            (s->br).bit_pos_ = uVar15 + uVar25;
            uVar18 = (uint32_t)uVar20;
            uVar15 = uVar31;
            if (uVar19 != uVar18) {
              uVar15 = 0;
            }
            uVar25 = uVar15 - 2 << (sbyte)uVar25 | 3;
            if (uVar15 == 0) {
              uVar25 = 3;
            }
            uVar31 = uVar26 + uVar25;
            iVar11 = uVar31 - uVar15;
            uVar19 = uVar18;
            if (uVar23 < iVar11 + uVar12) {
              uVar22 = 0xfffff;
              uVar28 = uVar23;
            }
            else {
              uVar28 = iVar11 + uVar12;
              if (uVar18 != 0) {
                iVar29 = (uVar26 + uVar25) - uVar15;
                uVar25 = s->next_symbol[uVar20];
                do {
                  uVar26 = uVar12;
                  puVar6[(int)uVar25] = (uint16_t)uVar26;
                  iVar29 = iVar29 + -1;
                  uVar12 = uVar26 + 1;
                  uVar25 = uVar26;
                } while (iVar29 != 0);
                s->next_symbol[uVar20] = uVar26;
                s->code_length_histo[uVar20] = s->code_length_histo[uVar20] + (short)iVar11;
                uVar22 = uVar22 - (iVar11 << (0xfU - (char)uVar20 & 0x1f));
                uVar28 = uVar26 + 1;
              }
            }
          }
        }
        uVar12 = uVar28;
      } while (3 < uVar24);
      bVar33 = true;
    }
LAB_00103417:
    if (bVar33) {
      uVar25 = s->symbol;
      BVar10 = BROTLI_DECODER_SUCCESS;
      if (uVar25 < uVar23) {
        uVar12 = s->space;
        do {
          if (uVar12 == 0) break;
          uVar31 = (s->br).bit_pos_;
          uVar26 = 0;
          if (uVar31 != 0x40) {
            uVar26 = (uint)(br_00->val_ >> ((byte)uVar31 & 0x3f));
          }
          bVar3 = s->table[uVar26 & 0x1f].bits;
          if (0x40 - uVar31 < (uint)bVar3) {
LAB_00103486:
            sVar27 = (s->br).avail_in;
            if (sVar27 != 0) {
              uVar24 = (s->br).val_;
              pbVar8 = (s->br).next_in;
              (s->br).val_ = uVar24 >> 8;
              (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar24 >> 8;
              puVar1 = &(s->br).bit_pos_;
              *puVar1 = *puVar1 - 8;
              (s->br).avail_in = sVar27 - 1;
              (s->br).next_in = pbVar8 + 1;
            }
            bVar33 = sVar27 == 0;
          }
          else {
            uVar4 = s->table[uVar26 & 0x1f].value;
            if (uVar4 < 0x10) {
              (s->br).bit_pos_ = uVar31 + bVar3;
              s->repeat = 0;
              uVar26 = (uint)uVar4;
              if (uVar26 != 0) {
                s->symbol_lists[s->next_symbol[uVar26]] = (uint16_t)uVar25;
                s->next_symbol[uVar26] = uVar25;
                s->prev_code_len = uVar26;
                uVar12 = uVar12 - (0x8000U >> ((byte)uVar4 & 0x1f));
                s->space = uVar12;
                s->code_length_histo[uVar26] = s->code_length_histo[uVar26] + 1;
              }
              uVar25 = uVar25 + 1;
              s->symbol = uVar25;
LAB_00103537:
              bVar33 = false;
            }
            else {
              uVar28 = ((uint)uVar4 + (uint)bVar3) - 0xe;
              if (0x40 - uVar31 < uVar28) goto LAB_00103486;
              uVar26 = uVar26 >> (bVar3 & 0x1f) & kBitMask[uVar4 - 0xe];
              (s->br).bit_pos_ = uVar28 + uVar31;
              if (uVar4 == 0x10) {
                uVar31 = s->prev_code_len;
                sVar13 = 2;
              }
              else {
                uVar31 = 0;
                sVar13 = 3;
              }
              if (s->repeat_code_len != uVar31) {
                s->repeat = 0;
                s->repeat_code_len = uVar31;
              }
              uVar31 = s->repeat;
              if (uVar31 != 0) {
                s->repeat = uVar31 - 2 << sVar13;
              }
              puVar6 = s->symbol_lists;
              uVar22 = s->repeat;
              uVar19 = uVar26 + uVar22 + 3;
              s->repeat = uVar19;
              iVar11 = uVar19 - uVar31;
              uVar28 = iVar11 + uVar25;
              if (uVar23 < uVar28) {
                s->symbol = uVar23;
                s->space = 0xfffff;
                bVar33 = false;
                uVar12 = 0xfffff;
                uVar25 = uVar23;
              }
              else {
                uVar5 = s->repeat_code_len;
                uVar24 = (ulong)uVar5;
                if (uVar24 != 0) {
                  iVar29 = ((uVar22 + uVar26) - uVar31) + 3;
                  uVar26 = s->next_symbol[uVar24];
                  do {
                    uVar28 = uVar25;
                    puVar6[(int)uVar26] = (uint16_t)uVar28;
                    uVar25 = uVar28 + 1;
                    iVar29 = iVar29 + -1;
                    uVar26 = uVar28;
                  } while (iVar29 != 0);
                  s->symbol = uVar25;
                  s->next_symbol[uVar24] = uVar28;
                  uVar12 = uVar12 - (iVar11 << (0xfU - (char)uVar5 & 0x1f));
                  s->space = uVar12;
                  s->code_length_histo[uVar24] = s->code_length_histo[uVar24] + (short)iVar11;
                  goto LAB_00103537;
                }
                s->symbol = uVar28;
                bVar33 = false;
                uVar25 = uVar28;
              }
            }
          }
          if (bVar33) {
            BVar10 = BROTLI_DECODER_NEEDS_MORE_INPUT;
            break;
          }
        } while (uVar25 < uVar23);
      }
    }
    if (BVar10 != BROTLI_DECODER_SUCCESS) {
      return BVar10;
    }
    if (s->space != 0) {
      return BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE;
    }
    uVar12 = BrotliBuildHuffmanTable(table,8,s->symbol_lists,s->code_length_histo);
    goto LAB_00102fb8;
  }
  uVar12 = (s->br).bit_pos_;
  bVar33 = uVar12 - 0x3f < 2;
  if (bVar33) {
    sVar27 = (s->br).avail_in;
    if (sVar27 != 0) {
      uVar24 = (s->br).val_;
      pbVar8 = (s->br).next_in;
      (s->br).val_ = uVar24 >> 8;
      (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar24 >> 8;
      uVar12 = uVar12 - 8;
      (s->br).bit_pos_ = uVar12;
      (s->br).avail_in = sVar27 - 1;
      (s->br).next_in = pbVar8 + 1;
      bVar33 = false;
      goto LAB_00102d6a;
    }
  }
  else {
LAB_00102d6a:
    s->symbol = (uint)((s->br).val_ >> ((byte)uVar12 & 0x3f)) & 3;
    (s->br).bit_pos_ = uVar12 + 2;
  }
  if (bVar33) {
    BVar10 = BROTLI_DECODER_NEEDS_MORE_INPUT;
    BVar14 = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
    goto LAB_00102fc8;
  }
  s->sub_loop_counter = 0;
switchD_00102ca4_caseD_2:
  BVar10 = uVar23 + BROTLI_DECODER_ERROR_FORMAT_EXUBERANT_NIBBLE;
  uVar25 = 0x1f;
  if (BVar10 != BROTLI_DECODER_NO_ERROR) {
    for (; (uint)BVar10 >> uVar25 == 0; uVar25 = uVar25 - 1) {
    }
  }
  uVar25 = (uVar25 ^ 0xffffffe0) + 0x21;
  if (BVar10 == BROTLI_DECODER_NO_ERROR) {
    uVar25 = 0;
  }
  uVar12 = s->sub_loop_counter;
  uVar26 = s->symbol;
  do {
    if (uVar26 < uVar12) {
      uVar23 = 2;
      uVar24 = 0;
      goto LAB_00102ea4;
    }
    uVar31 = (s->br).bit_pos_;
    bVar33 = 0x40 - uVar31 < uVar25;
    if (bVar33) {
      sVar27 = (s->br).avail_in;
      if (sVar27 == 0) {
        bVar33 = true;
      }
      else {
        uVar32 = (s->br).val_;
        uVar28 = 0x48 - uVar31;
        pbVar8 = (s->br).next_in;
        do {
          uVar31 = uVar31 - 8;
          sVar27 = sVar27 - 1;
          (s->br).val_ = uVar32 >> 8;
          uVar32 = (ulong)*pbVar8 << 0x38 | uVar32 >> 8;
          (s->br).val_ = uVar32;
          (s->br).bit_pos_ = uVar31;
          (s->br).avail_in = sVar27;
          (s->br).next_in = pbVar8 + 1;
          bVar33 = uVar28 < uVar25;
          if (!bVar33) goto LAB_00102e43;
          uVar28 = uVar28 + 8;
          pbVar8 = pbVar8 + 1;
        } while (sVar27 != 0);
      }
    }
    else {
LAB_00102e43:
      in_R9D = (uint)((s->br).val_ >> ((byte)uVar31 & 0x3f)) & kBitMask[uVar25];
      (s->br).bit_pos_ = uVar31 + uVar25;
    }
    if (bVar33) {
      s->sub_loop_counter = uVar12;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_READ;
      BVar10 = BROTLI_DECODER_NEEDS_MORE_INPUT;
LAB_00102e7a:
      bVar33 = false;
    }
    else {
      if (uVar23 <= in_R9D) {
        BVar10 = BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_ALPHABET;
        goto LAB_00102e7a;
      }
      s->symbols_lists_array[uVar12] = (uint16_t)in_R9D;
      uVar12 = uVar12 + 1;
      bVar33 = true;
    }
  } while (bVar33);
LAB_00102efe:
  if (BVar10 != BROTLI_DECODER_SUCCESS) {
    return BVar10;
  }
LAB_00102f07:
  if (s->symbol == 3) {
    uVar23 = (s->br).bit_pos_;
    bVar33 = uVar23 == 0x40;
    if (bVar33) {
      sVar27 = (s->br).avail_in;
      if (sVar27 != 0) {
        uVar24 = (s->br).val_;
        pbVar8 = (s->br).next_in;
        (s->br).val_ = uVar24 >> 8;
        (s->br).val_ = (ulong)*pbVar8 << 0x38 | uVar24 >> 8;
        uVar23 = 0x38;
        (s->br).bit_pos_ = 0x38;
        (s->br).avail_in = sVar27 - 1;
        (s->br).next_in = pbVar8 + 1;
        bVar33 = false;
        goto LAB_00102f64;
      }
      uVar25 = 0;
    }
    else {
LAB_00102f64:
      uVar25 = (uint)(((s->br).val_ >> ((ulong)uVar23 & 0x3f) & 1) != 0);
      (s->br).bit_pos_ = uVar23 + 1;
    }
    if (bVar33) {
      s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
      return BROTLI_DECODER_NEEDS_MORE_INPUT;
    }
    s->symbol = uVar25 + 3;
  }
  uVar12 = BrotliBuildSimpleHuffmanTable(table,8,s->symbols_lists_array,s->symbol);
LAB_00102fb8:
  if (opt_table_size != (uint32_t *)0x0) {
    *opt_table_size = uVar12;
  }
  BVar10 = BROTLI_DECODER_SUCCESS;
  BVar14 = BROTLI_STATE_HUFFMAN_NONE;
LAB_00102fc8:
  s->substate_huffman = BVar14;
  return BVar10;
LAB_00102ea4:
  do {
    if (uVar24 == uVar26) {
      BVar10 = BROTLI_DECODER_SUCCESS;
      break;
    }
    puVar6 = s->symbols_lists_array + uVar24;
    uVar24 = uVar24 + 1;
    uVar25 = uVar23;
    if (*puVar6 == s->symbols_lists_array[uVar24 & 0xffffffff]) {
      bVar33 = false;
      BVar9 = BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
    }
    else {
      do {
        bVar33 = uVar26 < uVar25;
        BVar9 = BVar10;
        if (uVar26 < uVar25) break;
        uVar30 = (ulong)uVar25;
        uVar25 = uVar25 + 1;
        BVar9 = BROTLI_DECODER_ERROR_FORMAT_SIMPLE_HUFFMAN_SAME;
      } while (*puVar6 != s->symbols_lists_array[uVar30]);
    }
    BVar10 = BVar9;
    uVar23 = uVar23 + 1;
  } while (bVar33);
  goto LAB_00102efe;
}

Assistant:

static BrotliDecoderErrorCode ReadHuffmanCode(uint32_t alphabet_size,
                                              HuffmanCode* table,
                                              uint32_t* opt_table_size,
                                              BrotliDecoderState* s) {
  BrotliBitReader* br = &s->br;
  /* Unnecessary masking, but might be good for safety. */
  alphabet_size &= 0x3ff;
  /* State machine */
  switch (s->substate_huffman) {
    case BROTLI_STATE_HUFFMAN_NONE:
      if (!BrotliSafeReadBits(br, 2, &s->sub_loop_counter)) {
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      BROTLI_LOG_UINT(s->sub_loop_counter);
      /* The value is used as follows:
         1 for simple code;
         0 for no skipping, 2 skips 2 code lengths, 3 skips 3 code lengths */
      if (s->sub_loop_counter != 1) {
        s->space = 32;
        s->repeat = 0; /* num_codes */
        memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo[0]) *
            (BROTLI_HUFFMAN_MAX_CODE_LENGTH_CODE_LENGTH + 1));
        memset(&s->code_length_code_lengths[0], 0,
            sizeof(s->code_length_code_lengths));
        s->substate_huffman = BROTLI_STATE_HUFFMAN_COMPLEX;
        goto Complex;
      }
      /* No break, transit to the next state. */

    case BROTLI_STATE_HUFFMAN_SIMPLE_SIZE:
      /* Read symbols, codes & code lengths directly. */
      if (!BrotliSafeReadBits(br, 2, &s->symbol)) { /* num_symbols */
        s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_SIZE;
        return BROTLI_DECODER_NEEDS_MORE_INPUT;
      }
      s->sub_loop_counter = 0;
      /* No break, transit to the next state. */
    case BROTLI_STATE_HUFFMAN_SIMPLE_READ: {
      BrotliDecoderErrorCode result =
          ReadSimpleHuffmanSymbols(alphabet_size, s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_SIMPLE_BUILD: {
      uint32_t table_size;
      if (s->symbol == 3) {
        uint32_t bits;
        if (!BrotliSafeReadBits(br, 1, &bits)) {
          s->substate_huffman = BROTLI_STATE_HUFFMAN_SIMPLE_BUILD;
          return BROTLI_DECODER_NEEDS_MORE_INPUT;
        }
        s->symbol += bits;
      }
      BROTLI_LOG_UINT(s->symbol);
      table_size = BrotliBuildSimpleHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbols_lists_array, s->symbol);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

Complex: /* Decode Huffman-coded code lengths. */
    case BROTLI_STATE_HUFFMAN_COMPLEX: {
      uint32_t i;
      BrotliDecoderErrorCode result = ReadCodeLengthCodeLengths(s);
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }
      BrotliBuildCodeLengthsHuffmanTable(s->table,
                                         s->code_length_code_lengths,
                                         s->code_length_histo);
      memset(&s->code_length_histo[0], 0, sizeof(s->code_length_histo));
      for (i = 0; i <= BROTLI_HUFFMAN_MAX_CODE_LENGTH; ++i) {
        s->next_symbol[i] = (int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
        s->symbol_lists[(int)i - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1)] = 0xFFFF;
      }

      s->symbol = 0;
      s->prev_code_len = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
      s->repeat = 0;
      s->repeat_code_len = 0;
      s->space = 32768;
      s->substate_huffman = BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS;
      /* No break, transit to the next state. */
    }
    case BROTLI_STATE_HUFFMAN_LENGTH_SYMBOLS: {
      uint32_t table_size;
      BrotliDecoderErrorCode result = ReadSymbolCodeLengths(alphabet_size, s);
      if (result == BROTLI_DECODER_NEEDS_MORE_INPUT) {
        result = SafeReadSymbolCodeLengths(alphabet_size, s);
      }
      if (result != BROTLI_DECODER_SUCCESS) {
        return result;
      }

      if (s->space != 0) {
        BROTLI_LOG(("[ReadHuffmanCode] space = %d\n", s->space));
        return BROTLI_FAILURE(BROTLI_DECODER_ERROR_FORMAT_HUFFMAN_SPACE);
      }
      table_size = BrotliBuildHuffmanTable(
          table, HUFFMAN_TABLE_BITS, s->symbol_lists, s->code_length_histo);
      if (opt_table_size) {
        *opt_table_size = table_size;
      }
      s->substate_huffman = BROTLI_STATE_HUFFMAN_NONE;
      return BROTLI_DECODER_SUCCESS;
    }

    default:
      return
          BROTLI_FAILURE(BROTLI_DECODER_ERROR_UNREACHABLE);
  }
}